

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O3

Group * __thiscall VArenaAlloc::make<rlottie::internal::model::Group>(VArenaAlloc *this)

{
  int iVar1;
  Group *pGVar2;
  
  pGVar2 = (Group *)allocObjectWithFooter(this,0x38,8);
  iVar1 = *(int *)&this->fCursor;
  this->fCursor = (char *)(pGVar2 + 1);
  installFooter(this,make<rlottie::internal::model::Group>::anon_class_1_0_00000001::__invoke,
                (int)pGVar2 - iVar1);
  (pGVar2->super_Object).field_0.mPtr = (char *)0x0;
  (pGVar2->super_Object).field_0.mData._type = Group;
  *(byte *)((long)&(pGVar2->super_Object).field_0 + 0xf) =
       *(byte *)((long)&(pGVar2->super_Object).field_0 + 0xf) & 0xf8 | 5;
  (pGVar2->mChildren).
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar2->mChildren).
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar2->mChildren).
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar2->mTransform = (Transform *)0x0;
  return pGVar2;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }